

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *o,RectMatrix<double,_3U,_3U> *m)

{
  ostream *this;
  RectMatrix<double,_3U,_3U> *in_RSI;
  ostream *in_RDI;
  double dVar1;
  uint j;
  uint i;
  uint local_18;
  uint local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    std::operator<<(in_RDI,"(");
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_14,local_18);
      std::ostream::operator<<(in_RDI,dVar1);
      if (local_18 != 2) {
        std::operator<<(in_RDI,"\t");
      }
    }
    this = std::operator<<(in_RDI,")");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                           const RectMatrix<Real, Row, Col>& m) {
    for (unsigned int i = 0; i < Row; i++) {
      o << "(";
      for (unsigned int j = 0; j < Col; j++) {
        o << m(i, j);
        if (j != Col - 1) o << "\t";
      }
      o << ")" << std::endl;
    }
    return o;
  }